

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void ppu_synchronize(Emulator *e)

{
  u8 *puVar1;
  u32 *puVar2;
  EmulatorEvent *pEVar3;
  u8 uVar4;
  byte bVar5;
  PPUState PVar6;
  bool bVar7;
  byte bVar8;
  bool bVar9;
  u8 uVar10;
  u8 uVar11;
  undefined1 uVar12;
  u8 uVar13;
  ObjPriority OVar14;
  Bool BVar15;
  Bool BVar16;
  uint uVar17;
  Ticks TVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  Obj *pOVar23;
  byte bVar24;
  Obj *pOVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  int local_a0;
  int local_88 [22];
  
  uVar19 = (e->state).ppu.sync_ticks;
  if ((uVar19 & 3) != 0) {
    __assert_fail("IS_ALIGNED(PPU.sync_ticks, CPU_TICK)",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",
                  0xddc,"void ppu_synchronize(Emulator *)");
  }
  uVar27 = (e->state).ticks & 0xfffffffffffffffc;
  lVar28 = uVar27 - uVar19;
  if (uVar19 <= uVar27 && lVar28 != 0) {
    if ((lVar28 != 0) && ((e->state).ppu.lcdc.display != FALSE)) {
      do {
        puVar1 = &(e->state).interrupt.if_;
        *puVar1 = *puVar1 | (e->state).interrupt.new_if & 3;
        (e->state).ppu.stat.mode2.trigger = FALSE;
        (e->state).ppu.stat.y_compare.trigger = FALSE;
        (e->state).ppu.stat.ly_eq_lyc = (e->state).ppu.stat.new_ly_eq_lyc;
        uVar4 = (e->state).ppu.ly;
        (e->state).ppu.last_ly = uVar4;
        puVar2 = &(e->state).ppu.state_ticks;
        *puVar2 = *puVar2 - 4;
        if (*puVar2 != 0) goto LAB_0010f544;
        TVar18 = uVar27 - lVar28;
        PVar6 = (e->state).ppu.state;
        switch(PVar6) {
        case PPU_STATE_HBLANK:
        case PPU_STATE_VBLANK_PLUS_4:
          puVar1 = &(e->state).ppu.line_y;
          *puVar1 = *puVar1 + '\x01';
          (e->state).ppu.ly = uVar4 + '\x01';
          (e->state).ppu.line_start_ticks = TVar18;
          check_ly_eq_lyc(e,FALSE);
          (e->state).ppu.state_ticks = 4;
          PVar6 = (e->state).ppu.state;
          if (PVar6 == PPU_STATE_VBLANK_PLUS_4) {
            if ((e->state).ppu.ly == 0x99) {
              (e->state).ppu.state = PPU_STATE_VBLANK_LY_0;
            }
            else {
              (e->state).ppu.state_ticks = 0x1c8;
            }
          }
          else {
            if (PVar6 != PPU_STATE_HBLANK) {
              __assert_fail("PPU.state == PPU_STATE_VBLANK_PLUS_4",
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                            ,0xe11,"void ppu_synchronize(Emulator *)");
            }
            (e->state).ppu.stat.mode2.trigger = TRUE;
            if ((e->state).ppu.ly == 0x90) {
              (e->state).ppu.state = PPU_STATE_VBLANK;
              (e->state).ppu.stat.trigger_mode = PPU_MODE_VBLANK;
              puVar2 = &(e->state).ppu.frame;
              *puVar2 = *puVar2 + 1;
              puVar1 = &(e->state).interrupt.new_if;
              *puVar1 = *puVar1 | 1;
              uVar4 = (e->state).ppu.display_delay_frames;
              if (uVar4 == '\0') {
                pEVar3 = &(e->state).event;
                *(byte *)pEVar3 = (byte)*pEVar3 | 1;
              }
              else {
                (e->state).ppu.display_delay_frames = uVar4 + 0xff;
              }
            }
            else {
              (e->state).ppu.state = PPU_STATE_HBLANK_PLUS_4;
              (e->state).ppu.stat.trigger_mode = PPU_MODE_MODE2;
              if ((e->state).ppu.rendering_window != FALSE) {
                puVar1 = &(e->state).ppu.win_y;
                *puVar1 = *puVar1 + '\x01';
              }
              if (((e->state).hdma.mode == HDMA_TRANSFER_MODE_HDMA) &&
                 (-1 < (char)(e->state).hdma.blocks)) {
                (e->state).hdma.state = DMA_ACTIVE;
              }
            }
          }
          break;
        case PPU_STATE_HBLANK_PLUS_4:
          (e->state).ppu.state = PPU_STATE_MODE2;
          (e->state).ppu.state_ticks = 0x50;
          (e->state).ppu.stat.mode = PPU_MODE_MODE2;
          dma_synchronize(e);
          if (((e->state).ppu.lcdc.obj_display != FALSE) && ((e->config).disable_obj == FALSE)) {
            bVar5 = "\b\x10"[(e->state).ppu.lcdc.obj_size];
            uVar4 = (e->state).ppu.line_y;
            uVar19 = 0;
            for (lVar22 = 0; lVar22 != 0x28; lVar22 = lVar22 + 1) {
              if ((byte)(uVar4 - (e->state).oam[lVar22].y) < bVar5) {
                pOVar23 = (e->state).oam + lVar22;
                iVar21 = (int)uVar19;
                if (0 < iVar21 && (e->state).is_cgb == FALSE) {
                  pOVar25 = (e->state).ppu.line_obj + (uVar19 - 1);
                  do {
                    if (pOVar25->x <= pOVar23->x) goto LAB_0010f879;
                    uVar10 = pOVar25->bank;
                    uVar11 = pOVar25->cgb_palette;
                    uVar12 = pOVar25->field_0x13;
                    pOVar25[1].palette = pOVar25->palette;
                    pOVar25[1].bank = uVar10;
                    pOVar25[1].cgb_palette = uVar11;
                    pOVar25[1].field_0x13 = uVar12;
                    uVar10 = pOVar25->x;
                    uVar11 = pOVar25->tile;
                    uVar13 = pOVar25->byte3;
                    OVar14 = pOVar25->priority;
                    BVar15 = pOVar25->yflip;
                    BVar16 = pOVar25->xflip;
                    pOVar25[1].y = pOVar25->y;
                    pOVar25[1].x = uVar10;
                    pOVar25[1].tile = uVar11;
                    pOVar25[1].byte3 = uVar13;
                    pOVar25[1].priority = OVar14;
                    pOVar25[1].yflip = BVar15;
                    pOVar25[1].xflip = BVar16;
                    pOVar25 = pOVar25 + -1;
                    bVar7 = 1 < uVar19;
                    uVar19 = uVar19 - 1;
                  } while (bVar7);
                  uVar19 = 0;
                }
LAB_0010f879:
                uVar10 = pOVar23->bank;
                uVar11 = pOVar23->cgb_palette;
                uVar12 = pOVar23->field_0x13;
                pOVar25 = (e->state).ppu.line_obj + (int)uVar19;
                pOVar25->palette = pOVar23->palette;
                pOVar25->bank = uVar10;
                pOVar25->cgb_palette = uVar11;
                pOVar25->field_0x13 = uVar12;
                uVar10 = pOVar23->x;
                uVar11 = pOVar23->tile;
                uVar13 = pOVar23->byte3;
                OVar14 = pOVar23->priority;
                BVar15 = pOVar23->yflip;
                BVar16 = pOVar23->xflip;
                pOVar25 = (e->state).ppu.line_obj + (int)uVar19;
                pOVar25->y = pOVar23->y;
                pOVar25->x = uVar10;
                pOVar25->tile = uVar11;
                pOVar25->byte3 = uVar13;
                pOVar25->priority = OVar14;
                pOVar25->yflip = BVar15;
                pOVar25->xflip = BVar16;
                uVar17 = iVar21 + 1;
                uVar19 = (ulong)uVar17;
                if (uVar17 == 10) {
                  uVar19 = 10;
                  break;
                }
              }
            }
            (e->state).ppu.line_obj_count = (u8)uVar19;
          }
          goto switchD_0010f572_default;
        case PPU_STATE_VBLANK:
          (e->state).ppu.state = PPU_STATE_VBLANK_PLUS_4;
          (e->state).ppu.state_ticks = 0x1c4;
          (e->state).ppu.stat.mode = PPU_MODE_VBLANK;
          break;
        case PPU_STATE_VBLANK_LY_0:
          (e->state).ppu.state = PPU_STATE_VBLANK_LY_0_PLUS_4;
          (e->state).ppu.state_ticks = 4;
          (e->state).ppu.ly = '\0';
          goto switchD_0010f572_default;
        case PPU_STATE_VBLANK_LY_0_PLUS_4:
          (e->state).ppu.state = PPU_STATE_VBLANK_LINE_Y_0;
          (e->state).ppu.state_ticks = 0x1c0;
          check_ly_eq_lyc(e,FALSE);
          break;
        case PPU_STATE_VBLANK_LINE_Y_0:
          (e->state).ppu.state = PPU_STATE_HBLANK_PLUS_4;
          (e->state).ppu.state_ticks = 4;
          (e->state).ppu.line_start_ticks = TVar18;
          (e->state).ppu.line_y = '\0';
          (e->state).ppu.win_y = '\0';
          (e->state).ppu.stat.mode2.trigger = TRUE;
          (e->state).ppu.stat.mode = PPU_MODE_HBLANK;
          (e->state).ppu.stat.trigger_mode = PPU_MODE_MODE2;
          break;
        case PPU_STATE_LCD_ON_MODE2:
        case PPU_STATE_MODE2:
          local_88[0x10] = 0;
          local_88[0x11] = 0;
          local_88[0x12] = 0;
          local_88[0x13] = 0;
          local_88[0xc] = 0;
          local_88[0xd] = 0;
          local_88[0xe] = 0;
          local_88[0xf] = 0;
          local_88[8] = 0;
          local_88[9] = 0;
          local_88[10] = 0;
          local_88[0xb] = 0;
          local_88[4] = 0;
          local_88[5] = 0;
          local_88[6] = 0;
          local_88[7] = 0;
          local_88[0x14] = 0;
          local_88[0x15] = 0;
          local_88[0] = 0;
          local_88[1] = 0;
          local_88[2] = 0;
          local_88[3] = 0;
          uVar17 = (e->state).ppu.scx & 7;
          uVar20 = uVar17 + 0xac;
          bVar5 = (e->state).ppu.line_obj_count;
          bVar7 = false;
          for (lVar22 = 0; (ulong)bVar5 * 0x14 - lVar22 != 0; lVar22 = lVar22 + 0x14) {
            bVar24 = (&(e->state).ppu.line_obj[0].x)[lVar22] + 8;
            if (bVar24 < 0xa8) {
              bVar9 = bVar7;
              if (!bVar7 && bVar24 == 0) {
                bVar9 = true;
              }
              uVar26 = 0;
              if (!bVar7 && bVar24 == 0) {
                uVar26 = uVar17;
              }
              bVar24 = bVar24 + (char)uVar17;
              bVar8 = bVar24 >> 3;
              iVar21 = 5 - (bVar24 & 7);
              if (iVar21 < local_88[bVar8]) {
                iVar21 = local_88[bVar8];
              }
              local_88[bVar8] = iVar21;
              uVar20 = uVar20 + uVar26 + 6;
              bVar7 = bVar9;
            }
          }
          for (lVar22 = 0; lVar22 != 0x16; lVar22 = lVar22 + 1) {
            uVar20 = uVar20 + local_88[lVar22];
          }
          uVar17 = (uint)((uVar20 & 3) == 0 && PVar6 != PPU_STATE_LCD_ON_MODE2);
          (e->state).ppu.state = PPU_STATE_MODE3 - uVar17;
          (e->state).ppu.state_ticks = uVar20 - uVar17 & 0xfffffffc;
          (e->state).ppu.stat.trigger_mode = PPU_MODE_MODE3;
          (e->state).ppu.stat.mode = PPU_MODE_MODE3;
          (e->state).ppu.mode3_render_ticks = TVar18;
          (e->state).ppu.render_x = '\0';
          (e->state).ppu.rendering_window = FALSE;
          break;
        case PPU_STATE_MODE3_EARLY_TRIGGER:
          (e->state).ppu.state = PPU_STATE_MODE3_COMMON;
          (e->state).ppu.state_ticks = 4;
          (e->state).ppu.stat.trigger_mode = PPU_MODE_HBLANK;
          break;
        case PPU_STATE_MODE3:
          (e->state).ppu.stat.trigger_mode = PPU_MODE_HBLANK;
        case PPU_STATE_MODE3_COMMON:
          ppu_mode3_synchronize(e);
          (e->state).ppu.state = PPU_STATE_HBLANK;
          local_a0 = (int)TVar18;
          (e->state).ppu.state_ticks = ((int)(e->state).ppu.line_start_ticks - local_a0) + 0x1c8;
          (e->state).ppu.stat.mode = PPU_MODE_HBLANK;
          break;
        case PPU_STATE_COUNT:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                        ,0xe68,"void ppu_synchronize(Emulator *)");
        default:
          goto switchD_0010f572_default;
        }
        check_stat(e);
switchD_0010f572_default:
        (e->state).ppu.sync_ticks = TVar18 + 4;
        calculate_next_ppu_intr(e);
LAB_0010f544:
        lVar28 = lVar28 + -4;
      } while (lVar28 != 0);
    }
    (e->state).ppu.sync_ticks = uVar27;
  }
  return;
}

Assistant:

static void ppu_synchronize(Emulator* e) {
  assert(IS_ALIGNED(PPU.sync_ticks, CPU_TICK));
  Ticks aligned_ticks = ALIGN_DOWN(TICKS, CPU_TICK);
  if (aligned_ticks > PPU.sync_ticks) {
    Ticks delta_ticks = aligned_ticks - PPU.sync_ticks;

    if (LCDC.display) {
      for (; delta_ticks > 0; delta_ticks -= CPU_TICK) {
        INTR.if_ |= (INTR.new_if & (IF_VBLANK | IF_STAT));
        STAT.mode2.trigger = FALSE;
        STAT.y_compare.trigger = FALSE;
        STAT.ly_eq_lyc = STAT.new_ly_eq_lyc;
        PPU.last_ly = PPU.ly;

        PPU.state_ticks -= CPU_TICK;
        if (LIKELY(PPU.state_ticks != 0)) {
          continue;
        }

        Ticks ticks = aligned_ticks - delta_ticks;

        switch (PPU.state) {
          case PPU_STATE_HBLANK:
          case PPU_STATE_VBLANK_PLUS_4:
            PPU.line_y++;
            PPU.ly++;
            PPU.line_start_ticks = ticks;
            check_ly_eq_lyc(e, FALSE);
            PPU.state_ticks = CPU_TICK;

            if (PPU.state == PPU_STATE_HBLANK) {
              STAT.mode2.trigger = TRUE;
              if (PPU.ly == SCREEN_HEIGHT) {
                PPU.state = PPU_STATE_VBLANK;
                STAT.trigger_mode = PPU_MODE_VBLANK;
                PPU.frame++;
                INTR.new_if |= IF_VBLANK;
                if (LIKELY(PPU.display_delay_frames == 0)) {
                  e->state.event |= EMULATOR_EVENT_NEW_FRAME;
                } else {
                  PPU.display_delay_frames--;
                }
              } else {
                PPU.state = PPU_STATE_HBLANK_PLUS_4;
                STAT.trigger_mode = PPU_MODE_MODE2;
                if (PPU.rendering_window) {
                  PPU.win_y++;
                }
                if (UNLIKELY(HDMA.mode == HDMA_TRANSFER_MODE_HDMA &&
                             (HDMA.blocks & 0x80) == 0)) {
                  HDMA.state = DMA_ACTIVE;
                }
              }
            } else {
              assert(PPU.state == PPU_STATE_VBLANK_PLUS_4);
              if (PPU.ly == SCREEN_HEIGHT_WITH_VBLANK - 1) {
                PPU.state = PPU_STATE_VBLANK_LY_0;
              } else {
                PPU.state_ticks = PPU_LINE_TICKS;
              }
            }
            check_stat(e);
            break;

          case PPU_STATE_HBLANK_PLUS_4:
            PPU.state = PPU_STATE_MODE2;
            PPU.state_ticks = PPU_MODE2_TICKS;
            STAT.mode = PPU_MODE_MODE2;
            do_ppu_mode2(e);
            break;

          case PPU_STATE_VBLANK:
            PPU.state = PPU_STATE_VBLANK_PLUS_4;
            PPU.state_ticks = PPU_LINE_TICKS - CPU_TICK;
            STAT.mode = PPU_MODE_VBLANK;
            check_stat(e);
            break;

          case PPU_STATE_VBLANK_LY_0:
            PPU.state = PPU_STATE_VBLANK_LY_0_PLUS_4;
            PPU.state_ticks = CPU_TICK;
            PPU.ly = 0;
            break;

          case PPU_STATE_VBLANK_LY_0_PLUS_4:
            PPU.state = PPU_STATE_VBLANK_LINE_Y_0;
            PPU.state_ticks = PPU_LINE_TICKS - CPU_TICK - CPU_TICK;
            check_ly_eq_lyc(e, FALSE);
            check_stat(e);
            break;

          case PPU_STATE_VBLANK_LINE_Y_0:
            PPU.state = PPU_STATE_HBLANK_PLUS_4;
            PPU.state_ticks = CPU_TICK;
            PPU.line_start_ticks = ticks;
            PPU.line_y = 0;
            PPU.win_y = 0;
            STAT.mode2.trigger = TRUE;
            STAT.mode = PPU_MODE_HBLANK;
            STAT.trigger_mode = PPU_MODE_MODE2;
            check_stat(e);
            break;

          case PPU_STATE_LCD_ON_MODE2:
          case PPU_STATE_MODE2:
            PPU.state_ticks = mode3_tick_count(e);
            if (PPU.state == PPU_STATE_LCD_ON_MODE2 ||
                (PPU.state_ticks & 3) != 0) {
              PPU.state = PPU_STATE_MODE3;
            } else {
              PPU.state = PPU_STATE_MODE3_EARLY_TRIGGER;
              PPU.state_ticks--;
            }
            PPU.state_ticks &= ~3;
            STAT.mode = STAT.trigger_mode = PPU_MODE_MODE3;
            PPU.mode3_render_ticks = ticks;
            PPU.render_x = 0;
            PPU.rendering_window = FALSE;
            check_stat(e);
            break;

          case PPU_STATE_MODE3_EARLY_TRIGGER:
            PPU.state = PPU_STATE_MODE3_COMMON;
            PPU.state_ticks = CPU_TICK;
            STAT.trigger_mode = PPU_MODE_HBLANK;
            check_stat(e);
            break;

          case PPU_STATE_MODE3:
            STAT.trigger_mode = PPU_MODE_HBLANK;
            /* fallthrough */

          case PPU_STATE_MODE3_COMMON:
            ppu_mode3_synchronize(e);
            PPU.state = PPU_STATE_HBLANK;
            PPU.state_ticks = PPU_LINE_TICKS + PPU.line_start_ticks - ticks;
            STAT.mode = PPU_MODE_HBLANK;
            check_stat(e);
            break;

          case PPU_STATE_COUNT:
            assert(0);
            break;
        }

        PPU.sync_ticks = ticks + CPU_TICK;
        calculate_next_ppu_intr(e);
      }
    }
    PPU.sync_ticks = aligned_ticks;
  }
}